

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm.cpp
# Opt level: O2

double benchmark<remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::matrix<double,remora::row_major,remora::cpu_tag>>
                 (matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                  *A,matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                     *B,matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                        *C)

{
  long lVar1;
  bool bVar2;
  double dVar3;
  undefined1 auVar4 [16];
  double dVar5;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  Timer time;
  
  lVar1 = 10;
  dVar3 = 1.79769313486232e+308;
  while (dVar5 = dVar3, bVar2 = lVar1 != 0, lVar1 = lVar1 + -1, bVar2) {
    Timer::Timer(&time,true);
    local_88 = *(undefined8 *)A;
    local_80 = *(undefined8 *)(A + 8);
    local_90 = *(undefined8 *)(A + 0x10);
    local_68 = *(undefined8 *)B;
    local_60 = *(undefined8 *)(B + 8);
    local_70 = *(undefined8 *)(B + 0x10);
    local_50 = 0x3ff0000000000000;
    local_a8 = *(undefined8 *)C;
    local_a0 = *(undefined8 *)(C + 8);
    local_b0 = *(undefined8 *)(C + 0x10);
    local_98 = local_a0;
    local_78 = local_80;
    local_58 = local_60;
    remora::
    matrix_matrix_prod<remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::matrix<double,remora::row_major,remora::cpu_tag>>
    ::
    plus_assign_to<remora::dense_matrix_adaptor<double,remora::row_major,remora::continuous_dense_tag,remora::cpu_tag>,remora::continuous_dense_tag>
              ((matrix_matrix_prod<remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::matrix<double,remora::row_major,remora::cpu_tag>>
                *)&local_90,&local_b0);
    dVar3 = Timer::stop(&time);
    if (dVar5 <= dVar3) {
      dVar3 = dVar5;
    }
  }
  lVar1 = *(long *)(A + 8) * *(long *)A * *(long *)(B + 8);
  auVar4._8_4_ = (int)((ulong)lVar1 >> 0x20);
  auVar4._0_8_ = lVar1;
  auVar4._12_4_ = 0x45300000;
  return (((auVar4._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) / dVar5) * 0.0009765625 *
         0.0009765625;
}

Assistant:

double benchmark(
	matrix_expression<AMat, cpu_tag> const& A,
	matrix_expression<BMat, cpu_tag> const& B,
	matrix_expression<CMat, cpu_tag> & C
){
	double minTime = std::numeric_limits<double>::max();
	for(std::size_t i = 0; i != 10; ++i){
		Timer time;
		noalias(C) += prod(A,B);
		minTime = std::min(minTime,time.stop());
	}
	return (A().size1()*A().size2()*B().size2())/minTime/1024/1024;
}